

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taskschedulertbb.cpp
# Opt level: O2

void embree::TaskScheduler::create(size_t numThreads,bool set_affinity,bool start_threads)

{
  int iVar1;
  global_control *pgVar2;
  task *ptVar3;
  auto_partitioner local_d9;
  BarrierSys barrier;
  BarrierSys *local_d0;
  task_traits local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  wait_context local_b0;
  task_group_context local_a0;
  
  pgVar2 = g_tbb_thread_control;
  if (g_tbb_threads_initialized == '\x01') {
    if (g_tbb_thread_control != (global_control *)0x0) {
      tbb::detail::d1::global_control::~global_control(g_tbb_thread_control);
    }
    operator_delete(pgVar2);
    g_tbb_thread_control = (global_control *)0x0;
    g_tbb_threads_initialized = '\0';
  }
  if (set_affinity) {
    tbb::detail::d1::task_scheduler_observer::observe((task_scheduler_observer *)tbb_affinity,true);
  }
  if (numThreads == 0xffffffffffffffff) {
    iVar1 = tbb::detail::d1::max_concurrency();
    numThreads = (size_t)iVar1;
  }
  else {
    g_tbb_threads_initialized = '\x01';
    iVar1 = tbb::detail::d1::max_concurrency();
    if ((_func_int **)(long)iVar1 < numThreads) {
      numThreads = (size_t)(long)iVar1;
    }
    pgVar2 = (global_control *)operator_new(0x18);
    tbb::detail::d1::global_control::global_control(pgVar2,max_allowed_parallelism,numThreads);
    g_tbb_thread_control = pgVar2;
  }
  if (start_threads) {
    BarrierSys::BarrierSys(&barrier,numThreads);
    local_d0 = &barrier;
    if ((_func_int **)numThreads != (_func_int **)0x0) {
      tbb::detail::d1::task_group_context::task_group_context(&local_a0,PARALLEL_FOR);
      local_c8.m_version_and_traits = 0;
      ptVar3 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_c8,0xc0);
      ptVar3->m_reserved[3] = 0;
      ptVar3->m_reserved[4] = 0;
      ptVar3->m_reserved[5] = 0;
      ptVar3->m_reserved[1] = 0;
      ptVar3->m_reserved[2] = 0;
      (ptVar3->super_task_traits).m_version_and_traits = 0;
      ptVar3->m_reserved[0] = 0;
      ptVar3->_vptr_task = (_func_int **)&PTR__task_00192530;
      ptVar3[1]._vptr_task = (_func_int **)numThreads;
      ptVar3[1].super_task_traits.m_version_and_traits = 0;
      ptVar3[1].m_reserved[0] = 1;
      ptVar3[1].m_reserved[1] = (uint64_t)&local_d0;
      ptVar3[1].m_reserved[2] = 0;
      ptVar3[1].m_reserved[3] = 1;
      tbb::detail::d1::auto_partition_type::auto_partition_type
                ((auto_partition_type *)(ptVar3[1].m_reserved + 5),&local_d9);
      ptVar3[2].super_task_traits.m_version_and_traits = local_c8.m_version_and_traits;
      local_c0 = 0;
      local_b8 = 1;
      local_b0.m_version_and_traits = 1;
      local_b0.m_ref_count.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1
      ;
      ptVar3[1].m_reserved[4] = (uint64_t)&local_c0;
      tbb::detail::r1::execute_and_wait(ptVar3,&local_a0,&local_b0,&local_a0);
      tbb::detail::d1::task_group_context::~task_group_context(&local_a0);
    }
    BarrierSys::~BarrierSys(&barrier);
  }
  return;
}

Assistant:

void TaskScheduler::create(size_t numThreads, bool set_affinity, bool start_threads)
  {
    assert(numThreads);

    /* first terminate threads in case we configured them */
    if (g_tbb_threads_initialized) {
#if TBB_INTERFACE_VERSION >= 11005
      delete g_tbb_thread_control;
      g_tbb_thread_control = nullptr;
#else
      g_tbb_threads.terminate();
#endif
      g_tbb_threads_initialized = false;
    }

    /* only set affinity if requested by the user */
#if TBB_INTERFACE_VERSION >= 9000 // affinity not properly supported by older TBB versions
    if (set_affinity)
      tbb_affinity.observe(true);
#endif

    /* now either keep default settings or configure number of threads */
    if (numThreads == std::numeric_limits<size_t>::max()) {
      numThreads = threadCount();
    }
    else {
      g_tbb_threads_initialized = true;
      const size_t max_concurrency = threadCount();
      if (numThreads > max_concurrency) numThreads = max_concurrency;
#if TBB_INTERFACE_VERSION >= 11005
      g_tbb_thread_control = new tbb::global_control(tbb::global_control::max_allowed_parallelism,numThreads);
#else
      g_tbb_threads.initialize(int(numThreads));
#endif
    }

    /* start worker threads */
    if (start_threads)
    {
      BarrierSys barrier(numThreads);
      tbb::parallel_for(size_t(0), size_t(numThreads), size_t(1), [&] ( size_t i ) {
          barrier.wait();
        });
    }
  }